

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O0

void QIntC::IntConverter<int,_unsigned_char,_true,_false>::error(int i)

{
  ostream *poVar1;
  range_error *this;
  string local_1c0 [48];
  locale local_190 [8];
  ostringstream local_188 [8];
  ostringstream msg;
  int i_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::locale::classic();
  std::ios::imbue(local_190);
  std::locale::~locale(local_190);
  poVar1 = std::operator<<((ostream *)local_188,"integer out of range converting ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,i);
  poVar1 = std::operator<<(poVar1," from a ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,4);
  poVar1 = std::operator<<(poVar1,"-byte signed type to a ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  std::operator<<(poVar1,"-byte unsigned type");
  this = (range_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::range_error::range_error(this,local_1c0);
  __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

static void
        error(From i)
        {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "integer out of range converting " << i << " from a " << sizeof(From)
                << "-byte signed type to a " << sizeof(To) << "-byte unsigned type";
            throw std::range_error(msg.str());
        }